

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

void hash_table_empty(hash_table_t *h)

{
  hash_entry_s *phVar1;
  hash_entry_t *phVar2;
  hash_entry_s *ptr;
  long lVar3;
  
  if (0 < h->size) {
    lVar3 = 0;
    do {
      phVar2 = h->table;
      ptr = phVar2[lVar3].next;
      if (phVar2[lVar3].next != (hash_entry_s *)0x0) {
        do {
          phVar1 = ptr->next;
          ckd_free(ptr);
          ptr = phVar1;
        } while (phVar1 != (hash_entry_s *)0x0);
        phVar2 = h->table;
      }
      phVar2[lVar3].val = (void *)0x0;
      (&phVar2[lVar3].val)[1] = (hash_entry_s *)0x0;
      phVar2[lVar3].key = (char *)0x0;
      phVar2[lVar3].len = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 < h->size);
  }
  h->inuse = 0;
  return;
}

Assistant:

void
hash_table_empty(hash_table_t *h)
{
    hash_entry_t *e, *e2;
    int32 i;

    for (i = 0; i < h->size; i++) {
        /* Free collision lists. */
        for (e = h->table[i].next; e; e = e2) {
            e2 = e->next;
            ckd_free((void *) e);
        }
        memset(&h->table[i], 0, sizeof(h->table[i]));
    }
    h->inuse = 0;
}